

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_file_handle.cpp
# Opt level: O1

string * __thiscall
duckdb::CSVFileHandle::ReadLine_abi_cxx11_(string *__return_storage_ptr__,CSVFileHandle *this)

{
  unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true> *this_00;
  pointer pcVar1;
  byte bVar2;
  bool bVar3;
  bool bVar4;
  idx_t iVar5;
  pointer pFVar6;
  pointer this_01;
  BinderException *this_02;
  char buffer [1];
  char local_61;
  string *local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  string local_50;
  
  local_58 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_58;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  this_00 = &this->file_handle;
  bVar4 = false;
  bVar2 = 0;
  local_60 = __return_storage_ptr__;
  do {
    iVar5 = Read(this,&local_61,1);
    if (iVar5 == 0) {
LAB_00b9041d:
      bVar3 = false;
      bVar4 = true;
    }
    else {
      if ((bool)(local_61 != '\n' & bVar2)) {
        pFVar6 = unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>::
                 operator->(this_00);
        bVar4 = FileHandle::CanSeek(pFVar6);
        if (!bVar4) {
          this_02 = (BinderException *)__cxa_allocate_exception(0x10);
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_50,
                     "Carriage return newlines not supported when reading CSV files in which we cannot seek"
                     ,"");
          BinderException::BinderException(this_02,&local_50);
          __cxa_throw(this_02,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
        }
        pFVar6 = unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>::
                 operator->(this_00);
        this_01 = unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>::
                  operator->(this_00);
        iVar5 = FileHandle::SeekPosition(this_01);
        FileHandle::Seek(pFVar6,iVar5 - 1);
        goto LAB_00b9041d;
      }
      if (local_61 == '\n') goto LAB_00b9041d;
      if (local_61 == '\r') {
        bVar2 = 1;
        bVar3 = true;
      }
      else {
        bVar3 = true;
        ::std::__cxx11::string::push_back((char)local_60);
      }
    }
    if (!bVar3) {
      if ((!bVar4) &&
         (pcVar1 = (local_60->_M_dataplus)._M_p,
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)pcVar1 != local_58)) {
        operator_delete(pcVar1);
      }
      return local_60;
    }
  } while( true );
}

Assistant:

string CSVFileHandle::ReadLine() {
	bool carriage_return = false;
	string result;
	char buffer[1];
	while (true) {
		idx_t bytes_read = Read(buffer, 1);
		if (bytes_read == 0) {
			return result;
		}
		if (carriage_return) {
			if (buffer[0] != '\n') {
				if (!file_handle->CanSeek()) {
					throw BinderException(
					    "Carriage return newlines not supported when reading CSV files in which we cannot seek");
				}
				file_handle->Seek(file_handle->SeekPosition() - 1);
				return result;
			}
		}
		if (buffer[0] == '\n') {
			return result;
		}
		if (buffer[0] != '\r') {
			result += buffer[0];
		} else {
			carriage_return = true;
		}
	}
}